

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboTestCase::checkFormatSupport(FboTestCase *this,deUint32 sizedFormat)

{
  uint uVar1;
  Context *pCVar2;
  bool bVar3;
  ContextType CVar4;
  NotSupportedError *this_00;
  const_iterator iter;
  pointer pbVar5;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  CVar4.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
  uVar1 = sizedFormat - 0x8229;
  if (uVar1 < 0x14) {
    if ((0xfff05U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xf0U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0049a416;
      goto LAB_0049a4c2;
    }
LAB_0049a56d:
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto switchD_0049a51e_caseD_8816;
  }
LAB_0049a416:
  if ((((sizedFormat - 0x8d62 < 0x2d) &&
       ((0x104104104001U >> ((ulong)(sizedFormat - 0x8d62) & 0x3f) & 1) != 0)) ||
      ((sizedFormat - 0x8051 < 9 && ((0x1e1U >> (sizedFormat - 0x8051 & 0x1f) & 1) != 0)))) ||
     ((sizedFormat - 0x81a5 < 2 || (sizedFormat - 0x8cac < 2)))) goto LAB_0049a56d;
  if ((sizedFormat != 0x8814) && (sizedFormat != 0x881a)) {
    if (sizedFormat != 0x88f0) {
      if (sizedFormat == 0x8c3a) goto LAB_0049a4c2;
      if (((sizedFormat == 0x8c43) || (sizedFormat == 0x8d48)) || (sizedFormat == 0x906f))
      goto LAB_0049a56d;
      goto LAB_0049a4ca;
    }
    goto LAB_0049a56d;
  }
LAB_0049a4c2:
  if (bVar3) goto LAB_0049a56d;
LAB_0049a4ca:
  CVar4.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(sizedFormat) {
  case 0x822d:
  case 0x822f:
switchD_0049a51e_caseD_881a:
    if (bVar3) goto switchD_0049a51e_caseD_8816;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"GL_EXT_color_buffer_half_float",&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_58);
    goto LAB_0049a659;
  case 0x822e:
  case 0x8230:
    goto switchD_0049a51e_caseD_8814;
  }
  switch(sizedFormat) {
  case 0x8814:
    goto switchD_0049a51e_caseD_8814;
  case 0x8815:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"GL_EXT_color_buffer_float",&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_58);
    break;
  case 0x8816:
  case 0x8817:
  case 0x8818:
  case 0x8819:
    goto switchD_0049a51e_caseD_8816;
  case 0x881a:
    goto switchD_0049a51e_caseD_881a;
  case 0x881b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"GL_EXT_color_buffer_half_float",&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_58);
    break;
  default:
    if (sizedFormat != 0x8c3a) goto switchD_0049a51e_caseD_8816;
switchD_0049a51e_caseD_8814:
    if (bVar3) goto switchD_0049a51e_caseD_8816;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"GL_EXT_color_buffer_float",&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_58);
  }
LAB_0049a659:
  std::__cxx11::string::~string((string *)&local_58);
switchD_0049a51e_caseD_8816:
  if (local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar2 = (this->super_TestCase).m_context;
    pbVar5 = local_38.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar5 == local_38.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"Format not supported",&local_59);
        tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
        __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      bVar3 = glu::ContextInfo::isExtensionSupported
                        (pCVar2->m_contextInfo,(pbVar5->_M_dataplus)._M_p);
      pbVar5 = pbVar5 + 1;
    } while (!bVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void FboTestCase::checkFormatSupport (deUint32 sizedFormat)
{
	const bool						isCoreFormat	= isRequiredFormat(sizedFormat, m_context.getRenderContext());
	const std::vector<std::string>	requiredExts	= (!isCoreFormat) ? getEnablingExtensions(sizedFormat, m_context.getRenderContext()) : std::vector<std::string>();

	// Check that we don't try to use invalid formats.
	DE_ASSERT(isCoreFormat || !requiredExts.empty());

	if (!requiredExts.empty() && !isAnyExtensionSupported(m_context, requiredExts))
		throw tcu::NotSupportedError("Format not supported");
}